

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O1

bool __thiscall smf::MidiFile::writeBase64(MidiFile *this,string *filename,int width)

{
  char cVar1;
  ostream *poVar2;
  undefined1 uVar3;
  fstream output;
  undefined1 auStack_228 [16];
  ostream local_218 [512];
  
  std::fstream::fstream(auStack_228,(filename->_M_dataplus)._M_p,_S_out|_S_bin);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Error: could not write: ",0x18);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(filename->_M_dataplus)._M_p,
                        filename->_M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    uVar3 = 0;
  }
  else {
    writeBase64(this,local_218,width);
    this->m_rwstatus = true;
    std::fstream::close();
    uVar3 = this->m_rwstatus;
  }
  std::fstream::~fstream(auStack_228);
  return (bool)uVar3;
}

Assistant:

bool MidiFile::writeBase64(const std::string& filename, int width) {
	std::fstream output(filename.c_str(), std::ios::binary | std::ios::out);

	if (!output.is_open()) {
		std::cerr << "Error: could not write: " << filename << std::endl;
		return false;
	}
	m_rwstatus = writeBase64(output, width);
	output.close();
	return m_rwstatus;
}